

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

void __thiscall ON_PointCloud::Dump(ON_PointCloud *this,ON_TextLog *dump)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *format;
  uint point_count;
  
  uVar3 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
  uVar1 = (this->m_N).m_count;
  uVar2 = (this->m_C).m_count;
  uVar4 = HiddenPointUnsignedCount(this);
  ON_TextLog::Print(dump,"ON_PointCloud: %d points\n",(ulong)uVar3);
  ON_TextLog::PushIndent(dump);
  uVar6 = 0;
  while ((int)uVar6 < (int)uVar3) {
    format = "...\n";
    uVar5 = uVar3 - 0x32;
    if ((int)uVar3 < 0x65 || uVar6 != 0x32) {
      ON_TextLog::Print(dump,"point[%2d]: ",(ulong)uVar6);
      ON_TextLog::Print(dump,(this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a + (int)uVar6);
      if (uVar3 == uVar1 && uVar3 != 0) {
        ON_TextLog::Print(dump,", normal = ");
        ON_TextLog::Print(dump,(this->m_N).m_a + (int)uVar6);
      }
      if (uVar3 == uVar2 && uVar3 != 0) {
        ON_TextLog::Print(dump,", color = ");
        ON_TextLog::PrintRGB(dump,(this->m_C).m_a + (int)uVar6);
      }
      uVar5 = uVar6;
      if ((int)uVar4 < 1) {
        format = "\n";
      }
      else {
        if ((this->m_H).m_a[(int)uVar6] == true) {
          ON_TextLog::Print(dump," (hidden)");
        }
        format = "\n";
      }
    }
    ON_TextLog::Print(dump,format);
    uVar6 = uVar5 + 1;
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_PointCloud::Dump( ON_TextLog& dump ) const
{
  // Aug 23, 2016 Tim - Fix for RH-35351
  // half_max is arbitrary, if you want more than 100 points 
  // change it to your liking. This is to prevent all of the 
  // points from displaying when you have a very large point 
  // cloud, like a billion. (see model on RH-35348)
  const int half_max = 50;

  int i;
  const bool bHasNormals = HasPointNormals();
  const bool bHasColors = HasPointColors();
  const bool bHasHiddenPoints = (HiddenPointCount() > 0);
  const int point_count = m_P.Count();
  dump.Print("ON_PointCloud: %d points\n",point_count);
  dump.PushIndent();
  for ( i = 0; i < point_count; i++ ) 
  {
    if (i == half_max && 2 * half_max < point_count)
    {
      dump.Print("...\n");
      i = point_count - half_max;
    }
    else
    {
      dump.Print("point[%2d]: ", i);
      dump.Print(m_P[i]);
      if (bHasNormals)
      {
        dump.Print(", normal = ");
        dump.Print(m_N[i]);
      }
      if (bHasColors)
      {
        dump.Print(", color = ");
        dump.PrintRGB(m_C[i]);
      }
      if (bHasHiddenPoints && m_H[i])
      {
        dump.Print(" (hidden)");
      }
      dump.Print("\n");
    }
  }
  dump.PopIndent();
}